

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localize.h
# Opt level: O2

void __thiscall
wasm::Localizer::Localizer(Localizer *this,Expression *input,Function *func,Module *wasm)

{
  Index index;
  LocalSet *pLVar1;
  Builder local_20;
  
  this->expr = input;
  if ((input->_id == LocalSetId) || (input->_id == LocalGetId)) {
    this->index = input[1]._id;
  }
  else {
    index = Builder::addVar(func,(Type)(input->type).id);
    this->index = index;
    local_20.wasm = wasm;
    pLVar1 = Builder::makeLocalTee(&local_20,index,this->expr,(Type)(this->expr->type).id);
    this->expr = (Expression *)pLVar1;
  }
  return;
}

Assistant:

Localizer(Expression* input, Function* func, Module* wasm) {
    expr = input;
    if (auto* get = expr->dynCast<LocalGet>()) {
      index = get->index;
    } else if (auto* set = expr->dynCast<LocalSet>()) {
      index = set->index;
    } else {
      index = Builder::addVar(func, expr->type);
      expr = Builder(*wasm).makeLocalTee(index, expr, expr->type);
    }
  }